

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O3

cio_error cio_uart_get_num_stop_bits(cio_uart *port,cio_uart_num_stop_bits *num_stop_bits)

{
  cio_error cVar1;
  termios tty;
  
  if (port != (cio_uart *)0x0) {
    cVar1 = get_current_settings(port,&tty);
    if (cVar1 == CIO_SUCCESS) {
      *num_stop_bits = tty.c_cflag >> 6 & CIO_UART_TWO_STOP_BITS;
    }
    return cVar1;
  }
  return CIO_INVALID_ARGUMENT;
}

Assistant:

enum cio_error cio_uart_get_num_stop_bits(const struct cio_uart *port, enum cio_uart_num_stop_bits *num_stop_bits)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	if ((tty.c_cflag & (tcflag_t)CSTOPB) == (tcflag_t)CSTOPB) {
		*num_stop_bits = CIO_UART_TWO_STOP_BITS;
	} else {
		*num_stop_bits = CIO_UART_ONE_STOP_BIT;
	}

	return CIO_SUCCESS;
}